

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O0

value_type __thiscall
protozero::
iterator_range<protozero::const_fixed_iterator<int>,_std::pair<protozero::const_fixed_iterator<int>,_protozero::const_fixed_iterator<int>_>_>
::front(iterator_range<protozero::const_fixed_iterator<int>,_std::pair<protozero::const_fixed_iterator<int>,_protozero::const_fixed_iterator<int>_>_>
        *this)

{
  bool bVar1;
  value_type_conflict3 vVar2;
  assert_error *this_00;
  iterator_range<protozero::const_fixed_iterator<int>,_std::pair<protozero::const_fixed_iterator<int>,_protozero::const_fixed_iterator<int>_>_>
  *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    vVar2 = const_fixed_iterator<int>::operator*((const_fixed_iterator<int> *)this);
    return vVar2;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"!empty()");
  __cxa_throw(this_00,&assert_error::typeinfo,assert_error::~assert_error);
}

Assistant:

value_type front() const {
        protozero_assert(!empty());
        return *(this->first);
    }